

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O2

void deqp::gles3::Functional::translateState
               (RenderState *src,FragmentOperationState *dst,RenderTarget *renderTarget)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestFunc TVar6;
  uint uVar7;
  uint uVar8;
  Vector<float,_4> VStack_58;
  Vector<float,_4> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = renderTarget->m_depthBits;
  uVar8 = 0;
  uVar7 = 0;
  iVar2 = renderTarget->m_stencilBits;
  dst->scissorTestEnabled = src->scissorTestEnabled;
  iVar3 = (src->scissorRectangle).bottom;
  iVar4 = (src->scissorRectangle).width;
  iVar5 = (src->scissorRectangle).height;
  (dst->scissorRectangle).left = (src->scissorRectangle).left;
  (dst->scissorRectangle).bottom = iVar3;
  (dst->scissorRectangle).width = iVar4;
  (dst->scissorRectangle).height = iVar5;
  if (0 < iVar2) {
    uVar7 = *(uint *)&src->stencilTestEnabled;
  }
  dst->stencilTestEnabled = SUB41(uVar7,0);
  if (0 < iVar1) {
    uVar8 = *(uint *)&src->depthTestEnabled;
  }
  dst->depthTestEnabled = SUB41(uVar8,0);
  dst->blendMode = (uint)src->blendEnabled;
  dst->numStencilBits = renderTarget->m_stencilBits;
  *(undefined4 *)(dst->colorMask).m_data = *(undefined4 *)(src->colorMask).m_data;
  if ((uVar8 & 1) != 0) {
    TVar6 = sglr::rr_util::mapGLTestFunc(src->depthFunc);
    dst->depthFunc = TVar6;
    dst->depthMask = src->depthWriteMask;
    uVar7 = (uint)dst->stencilTestEnabled;
  }
  if ((uVar7 & 1) != 0) {
    translateStencilState(src->stencil + 1,dst->stencilStates + 1);
    translateStencilState(src->stencil,dst->stencilStates);
  }
  if (src->blendEnabled == true) {
    translateBlendState(&src->blendRGBState,&dst->blendRGBState);
    translateBlendState(&src->blendAState,&dst->blendAState);
    tcu::Vector<float,_4>::Vector(&local_48,0.0);
    tcu::Vector<float,_4>::Vector(&VStack_58,1.0);
    tcu::clamp<float,4>((tcu *)&local_38,&src->blendColor,&local_48,&VStack_58);
    *(undefined8 *)(dst->blendColor).m_data = local_38;
    *(undefined8 *)((dst->blendColor).m_data + 2) = uStack_30;
  }
  return;
}

Assistant:

void translateState (const RenderState& src, rr::FragmentOperationState& dst, const tcu::RenderTarget& renderTarget)
{
	bool hasDepth		= renderTarget.getDepthBits() > 0;
	bool hasStencil		= renderTarget.getStencilBits() > 0;

	dst.scissorTestEnabled		= src.scissorTestEnabled;
	dst.scissorRectangle		= src.scissorRectangle;
	dst.stencilTestEnabled		= hasStencil && src.stencilTestEnabled;
	dst.depthTestEnabled		= hasDepth && src.depthTestEnabled;
	dst.blendMode				= src.blendEnabled ? rr::BLENDMODE_STANDARD : rr::BLENDMODE_NONE;
	dst.numStencilBits			= renderTarget.getStencilBits();

	dst.colorMask = src.colorMask;

	if (dst.depthTestEnabled)
	{
		dst.depthFunc	= sglr::rr_util::mapGLTestFunc(src.depthFunc);
		dst.depthMask	= src.depthWriteMask;
	}

	if (dst.stencilTestEnabled)
	{
		translateStencilState(src.stencil[rr::FACETYPE_BACK],	dst.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.stencil[rr::FACETYPE_FRONT],	dst.stencilStates[rr::FACETYPE_FRONT]);
	}

	if (src.blendEnabled)
	{
		translateBlendState(src.blendRGBState, dst.blendRGBState);
		translateBlendState(src.blendAState, dst.blendAState);
		dst.blendColor = tcu::clamp(src.blendColor, Vec4(0.0f), Vec4(1.0f));
	}
}